

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O0

ON_HatchPattern * __thiscall ON_HatchPattern::Duplicate(ON_HatchPattern *this)

{
  int iVar1;
  undefined4 extraout_var;
  ON_HatchPattern *this_local;
  
  iVar1 = (*(this->super_ON_ModelComponent).super_ON_Object._vptr_ON_Object[2])();
  return (ON_HatchPattern *)CONCAT44(extraout_var,iVar1);
}

Assistant:

ON_HatchPattern::HatchFillType ON_HatchPattern::HatchFillTypeFromUnsigned(
  unsigned hatch_fill_type_as_unsigned
  )
{
  switch (hatch_fill_type_as_unsigned)
  {
    ON_ENUM_FROM_UNSIGNED_CASE(ON_HatchPattern::HatchFillType::Solid);
    ON_ENUM_FROM_UNSIGNED_CASE(ON_HatchPattern::HatchFillType::Lines);
    //ON_ENUM_FROM_UNSIGNED_CASE(ON_HatchPattern::HatchFillType::Gradient);
  }
  ON_ERROR("Invalid hatch_fill_type_as_unsigned value.");
  return ON_HatchPattern::HatchFillType::Solid;
}